

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

IGUITab * __thiscall
irr::gui::CGUITabControl::insertTab(CGUITabControl *this,s32 idx,wchar_t *caption,s32 id)

{
  int iVar1;
  IGUIEnvironment *environment;
  vector2d<int> this_00;
  rect<int> local_40;
  
  if ((idx < 0) ||
     ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Tabs).m_data.
                         super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) < idx)) {
    this_00.X = 0;
    this_00.Y = 0;
  }
  else {
    this_00 = (vector2d<int>)operator_new(0x160);
    environment = *(IGUIEnvironment **)&this->field_0x128;
    local_40 = calcTabPos(this);
    CGUITab::CGUITab((CGUITab *)this_00,environment,(IGUIElement *)this,&local_40,id);
    (**(code **)(*(long *)this_00 + 0xa0))(this_00,caption);
    *(undefined4 *)((long)this_00 + 0x118) = 0;
    *(undefined4 *)((long)this_00 + 0x11c) = 1;
    *(undefined4 *)((long)this_00 + 0x120) = 0;
    *(undefined4 *)((long)this_00 + 0x124) = 1;
    (**(code **)(*(long *)this_00 + 0x78))(this_00,0);
    local_40.UpperLeftCorner = this_00;
    ::std::vector<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>::insert
              (&(this->Tabs).m_data,
               (const_iterator)
               ((this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_start + (uint)idx),(value_type *)&local_40);
    (this->Tabs).is_sorted = false;
    iVar1 = this->ActiveTabIndex;
    if (iVar1 == -1) {
      this->ActiveTabIndex = idx;
      (**(code **)(*(long *)this_00 + 0x78))(this_00,1);
    }
    else if (idx <= iVar1) {
      this->ActiveTabIndex = iVar1 + 1;
      setVisibleTab(this,iVar1 + 1);
    }
    recalculateScrollBar(this);
  }
  return (IGUITab *)this_00;
}

Assistant:

IGUITab *CGUITabControl::insertTab(s32 idx, const wchar_t *caption, s32 id)
{
	if (idx < 0 || idx > (s32)Tabs.size()) // idx == Tabs.size() is indeed OK here as core::array can handle that
		return NULL;

	CGUITab *tab = new CGUITab(Environment, this, calcTabPos(), id);

	tab->setText(caption);
	tab->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	tab->setVisible(false);
	Tabs.insert(tab, (u32)idx);

	if (ActiveTabIndex == -1) {
		ActiveTabIndex = (u32)idx;
		tab->setVisible(true);
	} else if (idx <= ActiveTabIndex) {
		++ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	}

	recalculateScrollBar();

	return tab;
}